

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O0

char * deqp::gls::RandomArrayGenerator::generateQuads
                 (int seed,int count,int componentCount,int offset,int stride,Primitive primitive,
                 InputType type,GLValue min,GLValue max,float gridSize)

{
  undefined1 min_00;
  undefined2 min_01;
  undefined1 max_00;
  undefined2 max_01;
  char *local_30;
  char *data;
  float gridSize_local;
  Primitive primitive_local;
  int stride_local;
  int offset_local;
  int componentCount_local;
  int count_local;
  int seed_local;
  
  local_30 = (char *)0x0;
  min_00 = min.field_1.b.m_value;
  min_01 = min.field_1.s.m_value;
  max_00 = max.field_1.b.m_value;
  max_01 = max.field_1.s.m_value;
  switch(type) {
  case INPUTTYPE_FLOAT:
    local_30 = createQuads<deqp::gls::GLValue::WrappedFloatType<float>>
                         (seed,count,componentCount,offset,stride,primitive,min.field_1.fl.m_value,
                          max.field_1.fl.m_value,gridSize);
    break;
  case INPUTTYPE_FIXED:
    local_30 = createQuads<deqp::gls::GLValue::Fixed>
                         (seed,count,componentCount,offset,stride,primitive,min.field_1.fi.m_value,
                          max.field_1.fi.m_value,gridSize);
    break;
  case INPUTTYPE_DOUBLE:
    local_30 = createQuads<deqp::gls::GLValue::WrappedFloatType<double>>
                         (seed,count,componentCount,offset,stride,primitive,min.field_1.d.m_value,
                          max.field_1.d.m_value,gridSize);
    break;
  case INPUTTYPE_BYTE:
    local_30 = createQuads<deqp::gls::GLValue::WrappedType<signed_char>>
                         (seed,count,componentCount,offset,stride,primitive,
                          (WrappedType<signed_char>)min_00,(WrappedType<signed_char>)max_00,gridSize
                         );
    break;
  case INPUTTYPE_SHORT:
    local_30 = createQuads<deqp::gls::GLValue::WrappedType<short>>
                         (seed,count,componentCount,offset,stride,primitive,
                          (WrappedType<short>)min_01,(WrappedType<short>)max_01,gridSize);
    break;
  case INPUTTYPE_UNSIGNED_BYTE:
    local_30 = createQuads<deqp::gls::GLValue::WrappedType<unsigned_char>>
                         (seed,count,componentCount,offset,stride,primitive,
                          (WrappedType<unsigned_char>)min_00,(WrappedType<unsigned_char>)max_00,
                          gridSize);
    break;
  case INPUTTYPE_UNSIGNED_SHORT:
    local_30 = createQuads<deqp::gls::GLValue::WrappedType<unsigned_short>>
                         (seed,count,componentCount,offset,stride,primitive,
                          (WrappedType<unsigned_short>)min_01,(WrappedType<unsigned_short>)max_01,
                          gridSize);
    break;
  case INPUTTYPE_INT:
    local_30 = createQuads<deqp::gls::GLValue::WrappedType<int>>
                         (seed,count,componentCount,offset,stride,primitive,
                          (WrappedType<int>)min.field_1.fl.m_value,
                          (WrappedType<int>)max.field_1.fl.m_value,gridSize);
    break;
  case INPUTTYPE_UNSIGNED_INT:
    local_30 = createQuads<deqp::gls::GLValue::WrappedType<unsigned_int>>
                         (seed,count,componentCount,offset,stride,primitive,
                          (WrappedType<unsigned_int>)min.field_1.fl.m_value,
                          (WrappedType<unsigned_int>)max.field_1.fl.m_value,gridSize);
    break;
  case INPUTTYPE_HALF:
    local_30 = createQuads<deqp::gls::GLValue::Half>
                         (seed,count,componentCount,offset,stride,primitive,(Half)min_01,
                          (Half)max_01,gridSize);
    break;
  case INPUTTYPE_UNSIGNED_INT_2_10_10_10:
  case INPUTTYPE_INT_2_10_10_10:
    local_30 = createQuadsPacked(seed,count,componentCount,offset,stride,primitive);
  }
  return local_30;
}

Assistant:

char* RandomArrayGenerator::generateQuads (int seed, int count, int componentCount, int offset, int stride, Array::Primitive primitive, Array::InputType type, GLValue min, GLValue max, float gridSize)
{
	char* data = DE_NULL;

	switch (type)
	{
		case Array::INPUTTYPE_FLOAT:
			data = createQuads<GLValue::Float>(seed, count, componentCount, offset, stride, primitive, min.fl, max.fl, gridSize);
			break;

		case Array::INPUTTYPE_FIXED:
			data = createQuads<GLValue::Fixed>(seed, count, componentCount, offset, stride, primitive, min.fi, max.fi, gridSize);
			break;

		case Array::INPUTTYPE_DOUBLE:
			data = createQuads<GLValue::Double>(seed, count, componentCount, offset, stride, primitive, min.d, max.d, gridSize);
			break;

		case Array::INPUTTYPE_BYTE:
			data = createQuads<GLValue::Byte>(seed, count, componentCount, offset, stride, primitive, min.b, max.b, gridSize);
			break;

		case Array::INPUTTYPE_SHORT:
			data = createQuads<GLValue::Short>(seed, count, componentCount, offset, stride, primitive, min.s, max.s, gridSize);
			break;

		case Array::INPUTTYPE_UNSIGNED_BYTE:
			data = createQuads<GLValue::Ubyte>(seed, count, componentCount, offset, stride, primitive, min.ub, max.ub, gridSize);
			break;

		case Array::INPUTTYPE_UNSIGNED_SHORT:
			data = createQuads<GLValue::Ushort>(seed, count, componentCount, offset, stride, primitive, min.us, max.us, gridSize);
			break;

		case Array::INPUTTYPE_UNSIGNED_INT:
			data = createQuads<GLValue::Uint>(seed, count, componentCount, offset, stride, primitive, min.ui, max.ui, gridSize);
			break;

		case Array::INPUTTYPE_INT:
			data = createQuads<GLValue::Int>(seed, count, componentCount, offset, stride, primitive, min.i, max.i, gridSize);
			break;

		case Array::INPUTTYPE_HALF:
			data = createQuads<GLValue::Half>(seed, count, componentCount, offset, stride, primitive, min.h, max.h, gridSize);
			break;

		case Array::INPUTTYPE_INT_2_10_10_10:
		case Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10:
			data = createQuadsPacked(seed, count, componentCount, offset, stride, primitive);
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	return data;
}